

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::checkDuplicateSwitchCases
          (CheckerVisitor *this,SwitchStatement *swtch)

{
  SwitchCase *pSVar1;
  bool bVar2;
  uint uVar3;
  int32_t j;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  if (this->effectsOnly == false) {
    uVar3 = (swtch->_cases)._size;
    uVar5 = 1;
    lVar8 = 0x10;
    for (lVar6 = 0; uVar4 = uVar5, lVar7 = lVar8, lVar6 < (int)(uVar3 - 1); lVar6 = lVar6 + 1) {
      for (; uVar4 < uVar3; uVar4 = uVar4 + 1) {
        pSVar1 = (swtch->_cases)._vals;
        bVar2 = NodeEqualChecker::check
                          ((NodeEqualChecker *)&this->field_0x20,&(pSVar1[lVar6].val)->super_Node,
                           *(Node **)((long)&pSVar1->val + lVar7));
        if (bVar2) {
          report(this,*(Node **)((long)&pSVar1->val + lVar7),0x42);
        }
        uVar3 = (swtch->_cases)._size;
        lVar7 = lVar7 + 0x10;
      }
      uVar5 = uVar5 + 1;
      lVar8 = lVar8 + 0x10;
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkDuplicateSwitchCases(SwitchStatement *swtch) {

  if (effectsOnly)
    return;

  const auto &cases = swtch->cases();

  for (int32_t i = 0; i < int32_t(cases.size()) - 1; ++i) {
    for (int32_t j = i + 1; j < cases.size(); ++j) {
      const auto &icase = cases[i];
      const auto &jcase = cases[j];

      if (_equalChecker.check(icase.val, jcase.val)) {
        report(jcase.val, DiagnosticsId::DI_DUPLICATE_CASE);
      }
    }
  }
}